

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

ExportedTableInfo *
duckdb::ExportedTableInfo::Deserialize
          (ExportedTableInfo *__return_storage_ptr__,Deserializer *deserializer)

{
  ClientContext *context;
  ExportedTableData local_140;
  ExportedTableData table_data;
  
  Deserializer::ReadProperty<duckdb::ExportedTableData>(&table_data,deserializer,1,"table_data");
  context = SerializationData::Get<duckdb::ClientContext&>(&deserializer->data);
  ExportedTableData::ExportedTableData(&local_140,&table_data);
  ExportedTableInfo(__return_storage_ptr__,context,&local_140);
  ExportedTableData::~ExportedTableData(&local_140);
  ExportedTableData::~ExportedTableData(&table_data);
  return __return_storage_ptr__;
}

Assistant:

ExportedTableInfo ExportedTableInfo::Deserialize(Deserializer &deserializer) {
	auto table_data = deserializer.ReadProperty<ExportedTableData>(1, "table_data");
	ExportedTableInfo result(deserializer.Get<ClientContext &>(), table_data);
	return result;
}